

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sceneloader.h
# Opt level: O0

void load_scene_json(Scene *scene,string *json)

{
  bool bVar1;
  undefined1 uVar2;
  streambuf *psVar3;
  Camera *pCVar4;
  reference this;
  reference ppOVar5;
  ostream *poVar6;
  size_type sVar7;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *this_00;
  undefined8 in_RSI;
  long in_RDI;
  Object *obj_2;
  iterator __end1_2;
  iterator __begin1_2;
  vector<Object_*,_std::allocator<Object_*>_> *__range1_2;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  obj_1;
  iterator __end1_1;
  iterator __begin1_1;
  value_type *__range1_1;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  obj;
  iterator __end1;
  iterator __begin1;
  value_type *__range1;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  u;
  string tmp;
  stringstream buffer;
  ifstream t;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_stack_000012f8;
  vector<Object_*,_std::allocator<Object_*>_> *in_stack_00001300;
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *in_stack_fffffffffffffa88;
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *in_stack_fffffffffffffa90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa98;
  input_adapter *in_stack_fffffffffffffaa0;
  undefined7 in_stack_fffffffffffffac8;
  undefined1 in_stack_fffffffffffffacf;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_stack_fffffffffffffad0;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_stack_fffffffffffffb18;
  Scene *in_stack_fffffffffffffb20;
  Object *pOVar8;
  __normal_iterator<Object_**,_std::vector<Object_*,_std::allocator<Object_*>_>_> local_4d0;
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *in_stack_fffffffffffffb38;
  Group *in_stack_fffffffffffffb40;
  char *in_stack_fffffffffffffb48;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_stack_fffffffffffffb50;
  undefined1 in_stack_fffffffffffffb9f;
  parser_callback_t *in_stack_fffffffffffffba0;
  input_adapter *in_stack_fffffffffffffba8;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_stack_fffffffffffffbb8;
  string local_3d0 [48];
  stringstream local_3a0 [16];
  undefined1 local_390 [376];
  undefined1 local_218 [528];
  long local_8;
  
  local_8 = in_RDI;
  std::ifstream::ifstream(local_218,in_RSI,8);
  std::__cxx11::stringstream::stringstream(local_3a0);
  psVar3 = (streambuf *)std::ifstream::rdbuf();
  std::ostream::operator<<(local_390,psVar3);
  std::__cxx11::stringstream::str();
  nlohmann::detail::input_adapter::
  input_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
  std::
  function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
  ::function((function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
              *)in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::parse(in_stack_fffffffffffffba8,in_stack_fffffffffffffba0,(bool)in_stack_fffffffffffffb9f);
  std::
  function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
  ::~function((function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
               *)0x281978);
  nlohmann::detail::input_adapter::~input_adapter((input_adapter *)0x281985);
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
  ::operator[]<char_const>(in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
  pCVar4 = json_parse_camera<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                     (in_stack_fffffffffffffbb8);
  *(Camera **)(local_8 + 0xe8) = pCVar4;
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
  ::operator[]<char_const>(in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::begin((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           *)in_stack_fffffffffffffa98);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::end((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
         *)in_stack_fffffffffffffa98);
  while( true ) {
    bVar1 = nlohmann::detail::
            iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            ::operator!=(in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
    if (!bVar1) break;
    nlohmann::detail::
    iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
    ::operator*(in_stack_fffffffffffffb38);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json(in_stack_fffffffffffffad0,
                 (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)CONCAT17(in_stack_fffffffffffffacf,in_stack_fffffffffffffac8));
    json_parse_object<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
              (in_stack_00001300,in_stack_000012f8);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)in_stack_fffffffffffffa90);
    nlohmann::detail::
    iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
    ::operator++(in_stack_fffffffffffffa90);
  }
  this = nlohmann::
         basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
         ::operator[]<char_const>(in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::begin((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           *)in_stack_fffffffffffffa98);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::end((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
         *)in_stack_fffffffffffffa98);
  while( true ) {
    uVar2 = nlohmann::detail::
            iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            ::operator!=(in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
    if (!(bool)uVar2) break;
    nlohmann::detail::
    iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
    ::operator*(in_stack_fffffffffffffb38);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json(this,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       *)CONCAT17(uVar2,in_stack_fffffffffffffac8));
    json_parse_light<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
              (in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)in_stack_fffffffffffffa90);
    nlohmann::detail::
    iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
    ::operator++(in_stack_fffffffffffffa90);
  }
  local_4d0._M_current =
       (Object **)
       std::vector<Object_*,_std::allocator<Object_*>_>::begin
                 ((vector<Object_*,_std::allocator<Object_*>_> *)in_stack_fffffffffffffa88);
  std::vector<Object_*,_std::allocator<Object_*>_>::end
            ((vector<Object_*,_std::allocator<Object_*>_> *)in_stack_fffffffffffffa88);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<Object_**,_std::vector<Object_*,_std::allocator<Object_*>_>_>
                        *)in_stack_fffffffffffffa90,
                       (__normal_iterator<Object_**,_std::vector<Object_*,_std::allocator<Object_*>_>_>
                        *)in_stack_fffffffffffffa88);
    if (!bVar1) break;
    ppOVar5 = __gnu_cxx::
              __normal_iterator<Object_**,_std::vector<Object_*,_std::allocator<Object_*>_>_>::
              operator*(&local_4d0);
    pOVar8 = *ppOVar5;
    if (pOVar8->remit == 1) {
      std::vector<Triangle_*,_std::allocator<Triangle_*>_>::push_back
                ((vector<Triangle_*,_std::allocator<Triangle_*>_> *)in_stack_fffffffffffffa90,
                 (value_type *)in_stack_fffffffffffffa88);
      *(float *)(local_8 + 0xe0) =
           *(float *)((long)&pOVar8[2]._vptr_Object + 4) + *(float *)(local_8 + 0xe0);
    }
    __gnu_cxx::__normal_iterator<Object_**,_std::vector<Object_*,_std::allocator<Object_*>_>_>::
    operator++(&local_4d0);
  }
  poVar6 = (ostream *)std::ostream::operator<<(&std::cerr,cntt);
  poVar6 = std::operator<<(poVar6,"|");
  sVar7 = std::vector<PointLight_*,_std::allocator<PointLight_*>_>::size
                    ((vector<PointLight_*,_std::allocator<PointLight_*>_> *)(local_8 + 0x98));
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,sVar7);
  poVar6 = std::operator<<(poVar6,",");
  sVar7 = std::vector<PointLight_*,_std::allocator<PointLight_*>_>::size
                    ((vector<PointLight_*,_std::allocator<PointLight_*>_> *)(local_8 + 0xb0));
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,sVar7);
  this_00 = (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             *)std::operator<<(poVar6,",");
  sVar7 = std::vector<Triangle_*,_std::allocator<Triangle_*>_>::size
                    ((vector<Triangle_*,_std::allocator<Triangle_*>_> *)(local_8 + 200));
  poVar6 = (ostream *)std::ostream::operator<<(this_00,sVar7);
  std::operator<<(poVar6,"\n");
  Group::reset_obj(in_stack_fffffffffffffb40);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(this_00);
  std::__cxx11::string::~string(local_3d0);
  std::__cxx11::stringstream::~stringstream(local_3a0);
  std::ifstream::~ifstream(local_218);
  return;
}

Assistant:

void load_scene_json(Scene& scene,std::string json)
{
	std::ifstream t(json);
	std::stringstream buffer;
	buffer << t.rdbuf();
	std::string tmp = buffer.str();
	auto u = json::parse(tmp);
	scene.camera = json_parse_camera(u["cam"]);
	for (auto obj : u["obj"])
		json_parse_object(scene.group.obj, obj);
	for (auto obj : u["light"])
		json_parse_light(scene,obj);
	for (auto obj : scene.group.obj)
		if (obj->remit==1)
			scene.triangle_lights.push_back((Triangle*)obj),
			scene.lights_area+=((Triangle*)obj)->area;
	std::cerr << cntt << "|"<<scene.point_lights.size() << ","<<scene.point_lights_decay.size()<<","<<scene.triangle_lights.size()<<"\n";
	scene.group.reset_obj();
}